

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int b;
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uchar *__ptr;
  int *piVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uchar *puVar8;
  uint uVar9;
  stbi__result_info *in_R9;
  ulong uVar10;
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  float fVar16;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar4 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      iVar7 = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar3 = (float *)stbi__malloc_mad4(iVar7,b,req_comp,(int)piVar4,iVar1);
      if (pfVar3 != (float *)0x0) {
        uVar9 = b * iVar7;
        if (0 < (int)uVar9) {
          uVar5 = (req_comp + (req_comp & 1U)) - 1;
          lVar6 = (long)req_comp;
          uVar10 = 0;
          puVar8 = __ptr;
          pfVar11 = pfVar3;
          do {
            uVar2 = 0;
            if (0 < (int)uVar5) {
              uVar13 = 0;
              do {
                fVar16 = powf((float)puVar8[uVar13] / 255.0,stbi__l2h_gamma);
                pfVar11[uVar13] = fVar16 * stbi__l2h_scale;
                uVar13 = uVar13 + 1;
                uVar2 = uVar5;
              } while (uVar5 != uVar13);
            }
            if ((int)uVar2 < req_comp) {
              lVar15 = (ulong)uVar2 + uVar10 * lVar6;
              pfVar3[lVar15] = (float)__ptr[lVar15] / 255.0;
            }
            uVar10 = uVar10 + 1;
            pfVar11 = pfVar11 + lVar6;
            puVar8 = puVar8 + lVar6;
          } while (uVar10 != uVar9);
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar3 != (float *)0x0) {
      if (stbi__vertically_flip_on_load == 0) {
        return pfVar3;
      }
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar9 = *y >> 1;
      if ((int)uVar9 < 1) {
        return pfVar3;
      }
      iVar1 = *x;
      lVar6 = (long)req_comp;
      iVar7 = (*y + -1) * iVar1;
      uVar10 = 0;
      pfVar11 = pfVar3;
      do {
        if (0 < iVar1) {
          pfVar12 = (float *)((long)iVar7 * lVar6 * 4 + (long)pfVar3);
          lVar15 = 0;
          pfVar14 = pfVar11;
          do {
            if (0 < req_comp) {
              uVar13 = 0;
              do {
                fVar16 = pfVar14[uVar13];
                pfVar14[uVar13] = pfVar12[uVar13];
                pfVar12[uVar13] = fVar16;
                uVar13 = uVar13 + 1;
              } while ((uint)req_comp != uVar13);
            }
            lVar15 = lVar15 + 1;
            pfVar12 = pfVar12 + lVar6;
            pfVar14 = pfVar14 + lVar6;
          } while (lVar15 != iVar1);
        }
        uVar10 = uVar10 + 1;
        iVar7 = iVar7 - iVar1;
        pfVar11 = pfVar11 + lVar6 * iVar1;
      } while (uVar10 != uVar9);
      return pfVar3;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}